

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaybeRemovedValue.hpp
# Opt level: O2

MaybeRemovedValue<supermap::ByteArray<1UL>_> __thiscall
supermap::io::DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void>::
deserialize(DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void> *this,
           istream *is)

{
  DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void> DVar1;
  undefined8 extraout_RDX;
  MaybeRemovedValue<supermap::ByteArray<1UL>_> MVar2;
  
  DeserializeHelper<supermap::ByteArray<1UL>,_void>::deserialize
            ((DeserializeHelper<supermap::ByteArray<1UL>,_void> *)this,is);
  DVar1 = (DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void>)
          ShallowDeserializer<bool,_void>::deserialize(is);
  this[8] = DVar1;
  MVar2._8_8_ = extraout_RDX;
  MVar2.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)this;
  return MVar2;
}

Assistant:

static MaybeRemovedValue<T> deserialize(std::istream &is) {
        return {
            io::deserialize<T>(is),
            io::deserialize<bool>(is)
        };
    }